

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<bool>::RemoveLast(RepeatedField<bool> *this)

{
  ulong uVar1;
  int v1;
  Nullable<const_char_*> failure_msg;
  bool is_soo;
  LogMessageFatal local_30;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  v1 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl(v1,0,"old_size > 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    is_soo = (uVar1 & 4) == 0;
    elements(this,is_soo);
    ExchangeCurrentSize(this,is_soo,v1 + -1);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x3c6,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}